

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

double GuessVerificationProgress(ChainTxData *data,CBlockIndex *pindex)

{
  ulong uVar1;
  ulong uVar2;
  time_t tVar3;
  long in_FS_OFFSET;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined4 uVar8;
  undefined1 auVar7 [16];
  double dVar9;
  undefined1 auVar10 [16];
  string_view source_file;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  dVar4 = 0.0;
  if (pindex != (CBlockIndex *)0x0) {
    if (pindex->m_chain_tx_count == 0) {
      FormatFullVersion_abi_cxx11_();
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "GuessVerificationProgress";
      logging_function._M_len = 0x19;
      LogPrintFormatInternal<int,char[13],std::__cxx11::string,char[42]>
                (logging_function,source_file,0x15ba,ALL,Warning,(ConstevalFormatString<4U>)0xcd37ae
                 ,&pindex->nHeight,(char (*) [13])"Bitcoin Core",&bStack_38,
                 (char (*) [42])"https://github.com/bitcoin/bitcoin/issues");
      std::__cxx11::string::~string((string *)&bStack_38);
      dVar4 = 0.0;
    }
    else {
      tVar3 = time((time_t *)0x0);
      uVar1 = pindex->m_chain_tx_count;
      uVar2 = data->tx_count;
      uVar8 = (undefined4)(uVar1 >> 0x20);
      if (uVar2 < uVar1) {
        auVar7._8_4_ = uVar8;
        auVar7._0_8_ = uVar1;
        auVar7._12_4_ = 0x45300000;
        dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        dVar6 = (double)(long)(tVar3 - (ulong)pindex->nTime) * data->dTxRate + dVar9;
      }
      else {
        auVar5._8_4_ = (int)(uVar2 >> 0x20);
        auVar5._0_8_ = uVar2;
        auVar5._12_4_ = 0x45300000;
        dVar6 = (double)(tVar3 - data->nTime) * data->dTxRate +
                (auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        auVar10._8_4_ = uVar8;
        auVar10._0_8_ = uVar1;
        auVar10._12_4_ = 0x45300000;
        dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      }
      dVar4 = 1.0;
      if (dVar9 / dVar6 <= 1.0) {
        dVar4 = dVar9 / dVar6;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return dVar4;
  }
  __stack_chk_fail();
}

Assistant:

double GuessVerificationProgress(const ChainTxData& data, const CBlockIndex *pindex) {
    if (pindex == nullptr)
        return 0.0;

    if (!Assume(pindex->m_chain_tx_count > 0)) {
        LogWarning("Internal bug detected: block %d has unset m_chain_tx_count (%s %s). Please report this issue here: %s\n",
                   pindex->nHeight, PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
        return 0.0;
    }

    int64_t nNow = time(nullptr);

    double fTxTotal;

    if (pindex->m_chain_tx_count <= data.tx_count) {
        fTxTotal = data.tx_count + (nNow - data.nTime) * data.dTxRate;
    } else {
        fTxTotal = pindex->m_chain_tx_count + (nNow - pindex->GetBlockTime()) * data.dTxRate;
    }

    return std::min<double>(pindex->m_chain_tx_count / fTxTotal, 1.0);
}